

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

bool __thiscall pbrt::StatsAccumulator::PrintCheckRare(StatsAccumulator *this,FILE *dest)

{
  float fVar1;
  Stats *pSVar2;
  double dVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM5_Qb;
  
  pSVar2 = this->stats;
  bVar5 = false;
  for (p_Var4 = (pSVar2->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pSVar2->rareChecks)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    auVar6._0_8_ = (double)(long)p_Var4[2]._M_parent / (double)(long)p_Var4[2]._M_left;
    auVar6._8_8_ = in_XMM5_Qb;
    auVar7._0_4_ = (float)auVar6._0_8_;
    auVar7._4_12_ = auVar6._4_12_;
    dVar3 = (1.0 / (double)(long)((long)&p_Var4[2]._M_left[-1]._M_right + 7)) * (double)auVar7._0_4_
            * (double)(1.0 - auVar7._0_4_);
    auVar8._0_4_ = (float)dVar3;
    auVar8._4_4_ = (int)((ulong)dVar3 >> 0x20);
    auVar8._8_8_ = 0;
    auVar6 = vfmadd231ss_fma(auVar7,auVar8,ZEXT416(0xc0000000));
    fVar1 = (float)p_Var4[2]._M_color;
    if (fVar1 <= auVar6._0_4_) {
      fprintf((FILE *)dest,
              "%s @ %.9g failures was %fx over limit %.9g (%ld samples, sigma est %.9g)\n",
              (double)auVar7._0_4_,(double)(auVar7._0_4_ / fVar1),(double)fVar1,(double)auVar8._0_4_
              ,*(undefined8 *)(p_Var4 + 1));
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool StatsAccumulator::PrintCheckRare(FILE *dest) {
    bool anyFailed = false;
    for (const auto &iter : stats->rareChecks) {
        const Stats::RareCheck &rc = iter.second;
        Float trueFreq = double(rc.numTrue) / double(rc.total);
        Float varianceEstimate = 1 / double(rc.total - 1) * trueFreq * (1 - trueFreq);
        if (trueFreq - 2 * varianceEstimate >= rc.maxFrequency) {
            fprintf(dest,
                    "%s @ %.9g failures was %fx over limit %.9g (%" PRId64
                    " samples, sigma est %.9g)\n",
                    iter.first.c_str(), trueFreq, trueFreq / rc.maxFrequency,
                    rc.maxFrequency, rc.total, varianceEstimate);
            anyFailed = true;
        }
    }
    return anyFailed;
}